

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
defyx::AssemblyGeneratorX86::h_ISMULH_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  int32_t iVar1;
  ostream *poVar2;
  Instruction *instr_00;
  int in_EDX;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  AssemblyGeneratorX86 *unaff_retaddr;
  
  in_RDI->registerUsage[in_RSI->dst] = in_EDX;
  if (in_RSI->src == in_RSI->dst) {
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov rax, ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->dst * 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\timul qword ptr [");
    poVar2 = std::operator<<(poVar2,regScratchpadAddr);
    instr_00 = (Instruction *)std::operator<<(poVar2,"+");
    iVar1 = genAddressImm(in_RDI,instr_00);
    poVar2 = (ostream *)std::ostream::operator<<(instr_00,iVar1);
    poVar2 = std::operator<<(poVar2,"]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    genAddressReg(unaff_retaddr,(Instruction *)in_RDI,(char *)in_RSI);
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov rax, ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->dst * 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\timul qword ptr [");
    poVar2 = std::operator<<(poVar2,regScratchpadAddr);
    poVar2 = std::operator<<(poVar2,"+rcx]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov ");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->dst * 8));
  poVar2 = std::operator<<(poVar2,", rdx");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  traceint(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_ISMULH_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr, "ecx");
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\timul qword ptr [" << regScratchpadAddr << "+rcx]" << std::endl;
		}
		else {
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\timul qword ptr [" << regScratchpadAddr << "+" << genAddressImm(instr) << "]" << std::endl;
		}
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}